

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::ImageSizeMachine::GenShader<tcu::Vector<float,4>>
          (string *__return_storage_ptr__,ImageSizeMachine *this,int stage)

{
  ostream *poVar1;
  int iVar2;
  char *pcVar3;
  ostringstream os;
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::operator<<(&local_190,"\n#define KSIZE 4");
  iVar2 = (int)this;
  pcVar3 = "\nlayout(std430) buffer OutputBuffer {\n  ivec4 count[KSIZE];\n};";
  if (iVar2 == 0) {
    pcVar3 = "\nflat out ivec4 count[KSIZE];";
  }
  std::operator<<(&local_190,pcVar3);
  poVar1 = std::operator<<(&local_190,"\nlayout(binding = 0, rgba32");
  ImageFormatPostfix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_1b0);
  poVar1 = std::operator<<(poVar1,") readonly writeonly uniform highp ");
  ImageTypePrefix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_1d0);
  poVar1 = std::operator<<(poVar1,"image2D g_image_2d;\nlayout(binding = 1, rgba32");
  ImageFormatPostfix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_1f0);
  poVar1 = std::operator<<(poVar1,") readonly writeonly uniform highp ");
  ImageTypePrefix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_210);
  poVar1 = std::operator<<(poVar1,"image3D g_image_3d;\nlayout(binding = 2, rgba32");
  ImageFormatPostfix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_230);
  poVar1 = std::operator<<(poVar1,") readonly writeonly uniform highp ");
  ImageTypePrefix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_250);
  poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(binding = 3, rgba32");
  ImageFormatPostfix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_270);
  poVar1 = std::operator<<(poVar1,") readonly writeonly uniform highp ");
  ImageTypePrefix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_290);
  std::operator<<(poVar1,"image2DArray g_image_2d_array;");
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1b0);
  if (iVar2 == 0) {
    pcVar3 = 
    "\nvoid main() {\n  int coord = gl_VertexID;\n#ifdef GL_ES\n  gl_PointSize = 1.0;\n#endif";
  }
  else if (iVar2 == 4) {
    pcVar3 = 
    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  int coord = int(gl_GlobalInvocationID.x);";
  }
  else {
    if (iVar2 != 5) goto LAB_00c6cff6;
    pcVar3 = "\nuniform int fakePrimitiveID;\nvoid main() {\n  int coord = fakePrimitiveID;";
  }
  std::operator<<(&local_190,pcVar3);
LAB_00c6cff6:
  std::operator<<(&local_190,
                  "\n  count[coord + 0] = ivec4(imageSize(g_image_2d), 0, 0);\n  count[coord + 1] = ivec4(imageSize(g_image_3d), 0);\n  count[coord + 2] = ivec4(imageSize(g_image_cube), 0, 0);\n  count[coord + 3] = ivec4(imageSize(g_image_2d_array), 0);\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string GenShader(int stage)
	{
		std::ostringstream os;
		os << NL "#define KSIZE 4";
		if (stage == 0)
		{ // VS uses transform feedback
			os << NL "flat out ivec4 count[KSIZE];";
		}
		else
		{ // CS + FS use SSBO
			os << NL "layout(std430) buffer OutputBuffer {" NL "  ivec4 count[KSIZE];" NL "};";
		}
		os << NL "layout(binding = 0, rgba32" << ImageFormatPostfix<T>() << ") readonly writeonly uniform highp "
		   << ImageTypePrefix<T>() << "image2D g_image_2d;" NL "layout(binding = 1, rgba32" << ImageFormatPostfix<T>()
		   << ") readonly writeonly uniform highp " << ImageTypePrefix<T>()
		   << "image3D g_image_3d;" NL "layout(binding = 2, rgba32" << ImageFormatPostfix<T>()
		   << ") readonly writeonly uniform highp " << ImageTypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(binding = 3, rgba32" << ImageFormatPostfix<T>()
		   << ") readonly writeonly uniform highp " << ImageTypePrefix<T>() << "image2DArray g_image_2d_array;";
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  int coord = gl_VertexID;" NL "#ifdef GL_ES" NL "  gl_PointSize = 1.0;" NL
					 "#endif";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL "  int coord = int(gl_GlobalInvocationID.x);";
		}
		else if (stage == 5)
		{ // FS
			os << NL "uniform int fakePrimitiveID;" NL "void main() {" NL "  int coord = fakePrimitiveID;";
		}
		os << NL "  count[coord + 0] = ivec4(imageSize(g_image_2d), 0, 0);" NL
				 "  count[coord + 1] = ivec4(imageSize(g_image_3d), 0);" NL
				 "  count[coord + 2] = ivec4(imageSize(g_image_cube), 0, 0);" NL
				 "  count[coord + 3] = ivec4(imageSize(g_image_2d_array), 0);" NL "}";
		return os.str();
	}